

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceValidators.cpp
# Opt level: O1

Result * CoreML::validateOptional(Result *__return_storage_ptr__,Model *format)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint32_t uVar2;
  Rep *pRVar3;
  bool bVar4;
  void **ppvVar5;
  long lVar6;
  undefined1 *puVar7;
  long lVar8;
  undefined1 *puVar9;
  size_type __dnew_1;
  Result r;
  size_type __dnew;
  string local_a8;
  undefined1 local_88 [8];
  _Alloc_hider local_80;
  undefined1 local_78 [24];
  char *local_60;
  _Alloc_hider local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  size_type local_38;
  
  Result::Result((Result *)&local_60);
  validateDefaultOptionalValues((Result *)local_88,format);
  local_60 = (char *)local_88;
  std::__cxx11::string::operator=((string *)&local_58,(string *)&local_80);
  if (local_80._M_p != local_78 + 8) {
    operator_delete(local_80._M_p,local_78._8_8_ + 1);
  }
  bVar4 = Result::good((Result *)&local_60);
  if (bVar4) {
    uVar2 = format->_oneof_case_[0];
    if ((int)uVar2 < 0x193) {
      if ((int)uVar2 < 0x12e) {
        if (2 < uVar2 - 200) goto LAB_00307e4e;
      }
      else if (uVar2 != 0x12e) {
        if (uVar2 == 0x12f) goto LAB_00307c75;
        if (uVar2 != 0x192) goto LAB_00307e4e;
      }
    }
    else if ((int)uVar2 < 0x1f6) {
      if ((uVar2 == 0x193) || (uVar2 == 500)) goto LAB_00307c75;
      if (uVar2 != 0x1f5) goto LAB_00307e4e;
    }
    else {
      if ((int)uVar2 < 900) {
        if (uVar2 == 0x1f6) goto LAB_00307c75;
        if (uVar2 == 0x259) goto LAB_00307cbf;
LAB_00307e4e:
        puVar9 = (undefined1 *)format->description_;
        if ((ModelDescription *)puVar9 == (ModelDescription *)0x0) {
          puVar9 = Specification::_ModelDescription_default_instance_;
        }
        pRVar3 = (((ModelDescription *)puVar9)->input_).super_RepeatedPtrFieldBase.rep_;
        ppvVar5 = pRVar3->elements;
        if (pRVar3 == (Rep *)0x0) {
          ppvVar5 = (void **)0x0;
        }
        lVar6 = (long)(((ModelDescription *)puVar9)->input_).super_RepeatedPtrFieldBase.
                      current_size_;
        bVar4 = lVar6 == 0;
        if (bVar4) {
LAB_00307f21:
          pRVar3 = (((ModelDescription *)puVar9)->output_).super_RepeatedPtrFieldBase.rep_;
          ppvVar5 = pRVar3->elements;
          if (pRVar3 == (Rep *)0x0) {
            ppvVar5 = (void **)0x0;
          }
          lVar6 = (long)(((ModelDescription *)puVar9)->output_).super_RepeatedPtrFieldBase.
                        current_size_;
          if (lVar6 == 0) {
LAB_00308008:
            Result::Result((Result *)local_88);
          }
          else {
            puVar9 = *(undefined1 **)((long)*ppvVar5 + 0x20);
            if (puVar9 == (undefined1 *)0x0) {
              puVar9 = Specification::_FeatureType_default_instance_;
            }
            if (puVar9[0x10] == '\0') {
              lVar8 = 8;
              do {
                if (lVar6 * 8 == lVar8) goto LAB_00308008;
                puVar9 = *(undefined1 **)(*(long *)((long)ppvVar5 + lVar8) + 0x20);
                if (puVar9 == (undefined1 *)0x0) {
                  puVar9 = Specification::_FeatureType_default_instance_;
                }
                lVar8 = lVar8 + 8;
              } while (puVar9[0x10] != '\x01');
            }
            local_38 = 0x1b;
            local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
            local_a8._M_dataplus._M_p =
                 (pointer)std::__cxx11::string::_M_create((ulong *)&local_a8,(ulong)&local_38);
            local_a8.field_2._M_allocated_capacity = local_38;
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a8._M_dataplus._M_p + 0xb) = 'n';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a8._M_dataplus._M_p + 0xc) = 'o';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a8._M_dataplus._M_p + 0xd) = 't';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a8._M_dataplus._M_p + 0xe) = ' ';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a8._M_dataplus._M_p + 0xf) = 'b';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a8._M_dataplus._M_p + 0x10) = 'e';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a8._M_dataplus._M_p + 0x11) = ' ';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a8._M_dataplus._M_p + 0x12) = 'o';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a8._M_dataplus._M_p + 0x13) = 'p';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a8._M_dataplus._M_p + 0x14) = 't';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a8._M_dataplus._M_p + 0x15) = 'i';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a8._M_dataplus._M_p + 0x16) = 'o';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a8._M_dataplus._M_p + 0x17) = 'n';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a8._M_dataplus._M_p + 0x18) = 'a';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a8._M_dataplus._M_p + 0x19) = 'l';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a8._M_dataplus._M_p + 0x1a) = '.';
            *(undefined8 *)local_a8._M_dataplus._M_p = 0x207374757074754f;
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a8._M_dataplus._M_p + 8) = 'c';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a8._M_dataplus._M_p + 9) = 'a';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a8._M_dataplus._M_p + 10) = 'n';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a8._M_dataplus._M_p + 0xb) = 'n';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a8._M_dataplus._M_p + 0xc) = 'o';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a8._M_dataplus._M_p + 0xd) = 't';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a8._M_dataplus._M_p + 0xe) = ' ';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a8._M_dataplus._M_p + 0xf) = 'b';
            local_a8._M_string_length = local_38;
            local_a8._M_dataplus._M_p[local_38] = '\0';
            Result::Result((Result *)local_88,INVALID_MODEL_INTERFACE,&local_a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
            }
          }
        }
        else {
          puVar7 = *(undefined1 **)((long)*ppvVar5 + 0x20);
          if (puVar7 == (undefined1 *)0x0) {
            puVar7 = Specification::_FeatureType_default_instance_;
          }
          if (puVar7[0x10] == '\0') {
            lVar8 = 8;
            do {
              bVar4 = lVar6 * 8 == lVar8;
              if (bVar4) goto LAB_00307f21;
              puVar7 = *(undefined1 **)(*(long *)((long)ppvVar5 + lVar8) + 0x20);
              if (puVar7 == (undefined1 *)0x0) {
                puVar7 = Specification::_FeatureType_default_instance_;
              }
              lVar8 = lVar8 + 8;
            } while (puVar7[0x10] != '\x01');
          }
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a8,"Features cannot be optional to this type of model.","");
          Result::Result((Result *)local_88,INVALID_MODEL_PARAMETERS,&local_a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
          if (bVar4) goto LAB_00307f21;
        }
      }
      else {
        if (uVar2 == 900) goto LAB_00307cbf;
        if (uVar2 != 3000) goto LAB_00307e4e;
LAB_00307c75:
        puVar9 = (undefined1 *)format->description_;
        if ((ModelDescription *)puVar9 == (ModelDescription *)0x0) {
          puVar9 = Specification::_ModelDescription_default_instance_;
        }
        validateOptionalNN((Result *)local_88,(ModelDescription *)puVar9);
      }
      local_60 = (char *)local_88;
      std::__cxx11::string::operator=((string *)&local_58,(string *)&local_80);
      if (local_80._M_p != local_78 + 8) {
        operator_delete(local_80._M_p,local_78._8_8_ + 1);
      }
    }
LAB_00307cbf:
    bVar4 = Result::good((Result *)&local_60);
    if (bVar4) {
      puVar9 = (undefined1 *)format->description_;
      if ((ModelDescription *)puVar9 == (ModelDescription *)0x0) {
        puVar9 = Specification::_ModelDescription_default_instance_;
      }
      pRVar3 = (((ModelDescription *)puVar9)->output_).super_RepeatedPtrFieldBase.rep_;
      ppvVar5 = pRVar3->elements;
      if (pRVar3 == (Rep *)0x0) {
        ppvVar5 = (void **)0x0;
      }
      lVar6 = (long)(((ModelDescription *)puVar9)->output_).super_RepeatedPtrFieldBase.current_size_
      ;
      bVar4 = lVar6 == 0;
      if (!bVar4) {
        puVar9 = *(undefined1 **)((long)*ppvVar5 + 0x20);
        if (puVar9 == (undefined1 *)0x0) {
          puVar9 = Specification::_FeatureType_default_instance_;
        }
        if (puVar9[0x10] == '\0') {
          lVar8 = 8;
          do {
            bVar4 = lVar6 * 8 == lVar8;
            if (bVar4) goto LAB_00307dc9;
            puVar9 = *(undefined1 **)(*(long *)((long)ppvVar5 + lVar8) + 0x20);
            if (puVar9 == (undefined1 *)0x0) {
              puVar9 = Specification::_FeatureType_default_instance_;
            }
            lVar8 = lVar8 + 8;
          } while (puVar9[0x10] != '\x01');
        }
        local_a8._M_dataplus._M_p = (pointer)0x1b;
        local_88 = (undefined1  [8])local_78;
        local_88 = (undefined1  [8])
                   std::__cxx11::string::_M_create((ulong *)local_88,(ulong)&local_a8);
        local_78._0_8_ = local_a8._M_dataplus._M_p;
        builtin_strncpy((char *)local_88,"Outputs cannot be optional.",0x1b);
        local_80._M_p = local_a8._M_dataplus._M_p;
        *(char *)((long)local_88 + (long)local_a8._M_dataplus._M_p) = '\0';
        Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_88);
        if (local_88 != (undefined1  [8])local_78) {
          operator_delete((void *)local_88,(ulong)(local_78._0_8_ + 1));
        }
        if (!bVar4) goto LAB_00307e21;
      }
LAB_00307dc9:
      Result::Result(__return_storage_ptr__);
      goto LAB_00307e21;
    }
  }
  *(char **)__return_storage_ptr__ = local_60;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p == &local_48) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_48._M_allocated_capacity._1_7_,local_48._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_48._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_58._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         CONCAT71(local_48._M_allocated_capacity._1_7_,local_48._M_local_buf[0]);
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_50;
  local_50 = 0;
  local_48._M_local_buf[0] = '\0';
  local_58._M_p = (pointer)&local_48;
LAB_00307e21:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p,
                    CONCAT71(local_48._M_allocated_capacity._1_7_,local_48._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result validateOptional(const Specification::Model& format) {
        Result r;
        r = validateDefaultOptionalValues(format);

        if (!r.good()) {
            return r;
        }

        switch (format.Type_case()) {
            case Specification::Model::kImputer:
                // Imputed values can be handled by replacing a particular value, so
                // optional is not required.
                break;
            case Specification::Model::kNeuralNetwork:
            case Specification::Model::kNeuralNetworkRegressor:
            case Specification::Model::kNeuralNetworkClassifier:
            case Specification::Model::kSerializedModel:
            case Specification::Model::kMlProgram:
                r = validateOptionalNN(format.description());
                break;
            case Specification::Model::kTreeEnsembleRegressor:
            case Specification::Model::kTreeEnsembleClassifier:
                // allow arbitrary optional in tree inputs, just check outputs
                break;
            case Specification::Model::kPipeline:
            case Specification::Model::kPipelineRegressor:
            case Specification::Model::kPipelineClassifier:
                // pipeline has valid optional inputs iff the models inside are valid.
                // this should be guaranteed by the pipeline validator.
                break;
            case Specification::Model::kItemSimilarityRecommender:
                // allow arbitrary optional in the recommender.  The recommender valiadator catches these.
                break;
            case Specification::Model::kIdentity:
                // anything goes for the identity function
                break;
            default:
                r = validateOptionalGeneric(format.description());
        }
        if (!r.good()) {
            return r;
        }

        return validateOptionalOutputs(format.description());
    }